

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O2

bool __thiscall F7ZFile::Open(F7ZFile *this,bool quiet)

{
  UInt64 *pUVar1;
  uint uVar2;
  DWORD DVar3;
  SRes SVar4;
  size_t c;
  C7zArchive *pCVar5;
  ulong *puVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  FResourceLump *this_00;
  ulong uVar10;
  char *format;
  int iVar11;
  long lVar12;
  FResourceLump *this_01;
  FString name;
  TArray<char,_char> nameASCII;
  TArray<unsigned_short,_unsigned_short> nameUTF16;
  FString local_40;
  ulong local_38;
  
  pCVar5 = (C7zArchive *)operator_new(0x4140);
  C7zArchive::C7zArchive(pCVar5,(this->super_FResourceFile).Reader);
  this->Archive = pCVar5;
  uVar2 = C7zArchive::Open(pCVar5);
  pCVar5 = this->Archive;
  if (uVar2 != 0) {
    if (pCVar5 != (C7zArchive *)0x0) {
      C7zArchive::~C7zArchive(pCVar5);
    }
    operator_delete(pCVar5,0x4140);
    this->Archive = (C7zArchive *)0x0;
    if (quiet) {
      return false;
    }
    Printf("\n\x1cG%s: ",(this->super_FResourceFile).Filename);
    if (uVar2 == 2) {
      format = "Cannot allocate memory\n";
    }
    else if (uVar2 == 3) {
      format = "CRC error\n";
    }
    else {
      if (uVar2 != 4) {
        Printf("error #%d\n",(ulong)uVar2);
        return false;
      }
      format = "Decoder does not support this archive\n";
    }
    Printf(format);
    return false;
  }
  uVar2 = (pCVar5->DB).NumFiles;
  uVar10 = (ulong)uVar2;
  (this->super_FResourceFile).NumLumps = uVar2;
  local_38 = uVar10 * 0x50 | 8;
  puVar6 = (ulong *)operator_new__(local_38);
  this_01 = (FResourceLump *)(puVar6 + 1);
  *puVar6 = uVar10;
  if (uVar10 != 0) {
    lVar12 = 0;
    this_00 = this_01;
    do {
      F7ZLump::F7ZLump((F7ZLump *)this_00);
      lVar12 = lVar12 + -0x50;
      this_00 = this_00 + 1;
    } while (uVar10 * -0x50 - lVar12 != 0);
  }
  this->Lumps = (F7ZLump *)this_01;
  nameUTF16.Array = (unsigned_short *)0x0;
  nameUTF16.Most = 0;
  nameUTF16.Count = 0;
  nameASCII.Array = (char *)0x0;
  nameASCII.Most = 0;
  nameASCII.Count = 0;
  iVar11 = 0;
  for (uVar10 = 0; uVar2 = (this->super_FResourceFile).NumLumps, uVar10 < uVar2; uVar10 = uVar10 + 1
      ) {
    if (((char)((pCVar5->DB).IsDirs[uVar10 >> 3] << ((byte)uVar10 & 7)) < '\0') ||
       (sVar7 = SzArEx_GetFileNameUtf16(&pCVar5->DB,uVar10,(UInt16 *)0x0), sVar7 == 0)) {
      iVar11 = iVar11 + 1;
    }
    else {
      TArray<unsigned_short,_unsigned_short>::Resize(&nameUTF16,(uint)sVar7);
      TArray<char,_char>::Resize(&nameASCII,(uint)sVar7);
      SzArEx_GetFileNameUtf16(&pCVar5->DB,uVar10,nameUTF16.Array);
      for (sVar8 = 0; sVar7 != sVar8; sVar8 = sVar8 + 1) {
        nameASCII.Array[sVar8] = (char)nameUTF16.Array[sVar8];
      }
      FixPathSeperator(nameASCII.Array);
      FString::FString(&name,nameASCII.Array);
      FString::ToLower(&name);
      FString::AttachToOther(&local_40,&name);
      FResourceLump::LumpNameSetup(this_01,&local_40);
      FString::~FString(&local_40);
      pUVar1 = (pCVar5->DB).UnpackPositions;
      this_01->LumpSize = (int)pUVar1[uVar10 + 1] - (int)pUVar1[uVar10];
      this_01->Owner = &this->super_FResourceFile;
      this_01->Flags = '\x02';
      *(int *)&this_01->field_0x4c = (int)uVar10;
      FResourceLump::CheckEmbedded(this_01);
      this_01 = this_01 + 1;
      FString::~FString(&name);
    }
  }
  DVar3 = uVar2 - iVar11;
  (this->super_FResourceFile).NumLumps = DVar3;
  if (DVar3 != 0) {
    name.Chars = (char *)0x0;
    TArray<char,_char>::Resize
              ((TArray<char,_char> *)&name,(this->Lumps->super_FResourceLump).LumpSize);
    SVar4 = C7zArchive::Extract(this->Archive,
                                *(UInt32 *)&(this->Lumps->super_FResourceLump).field_0x4c,name.Chars
                               );
    if (SVar4 != 0) {
      if (!quiet) {
        Printf("\n%s: unsupported 7z/LZMA file!\n",(this->super_FResourceFile).Filename);
      }
      TArray<char,_char>::~TArray((TArray<char,_char> *)&name);
      bVar9 = false;
      goto LAB_004c29a4;
    }
    TArray<char,_char>::~TArray((TArray<char,_char> *)&name);
  }
  if ((!quiet) && (batchrun == false)) {
    Printf(", %d lumps\n",(ulong)(this->super_FResourceFile).NumLumps);
  }
  bVar9 = true;
  FResourceFile::PostProcessArchive(&this->super_FResourceFile,this->Lumps,0x50);
LAB_004c29a4:
  TArray<char,_char>::~TArray(&nameASCII);
  TArray<unsigned_short,_unsigned_short>::~TArray(&nameUTF16);
  return bVar9;
}

Assistant:

bool F7ZFile::Open(bool quiet)
{
	Archive = new C7zArchive(Reader);
	int skipped = 0;
	SRes res;

	res = Archive->Open();
	if (res != SZ_OK)
	{
		delete Archive;
		Archive = NULL;
		if (!quiet)
		{
			Printf("\n" TEXTCOLOR_RED "%s: ", Filename);
			if (res == SZ_ERROR_UNSUPPORTED)
			{
				Printf("Decoder does not support this archive\n");
			}
			else if (res == SZ_ERROR_MEM)
			{
				Printf("Cannot allocate memory\n");
			}
			else if (res == SZ_ERROR_CRC)
			{
				Printf("CRC error\n");
			}
			else
			{
				Printf("error #%d\n", res);
			}
		}
		return false;
	}

	CSzArEx* const archPtr = &Archive->DB;

	NumLumps = archPtr->NumFiles;
	Lumps = new F7ZLump[NumLumps];

	F7ZLump *lump_p = Lumps;
	TArray<UInt16> nameUTF16;
	TArray<char> nameASCII;

	for (DWORD i = 0; i < NumLumps; ++i)
	{
		// skip Directories
		if (SzArEx_IsDir(archPtr, i))
		{
			skipped++;
			continue;
		}

		const size_t nameLength = SzArEx_GetFileNameUtf16(archPtr, i, NULL);

		if (0 == nameLength)
		{
			++skipped;
			continue;
		}

		nameUTF16.Resize((unsigned)nameLength);
		nameASCII.Resize((unsigned)nameLength);
		SzArEx_GetFileNameUtf16(archPtr, i, &nameUTF16[0]);
		for (size_t c = 0; c < nameLength; ++c)
		{
			nameASCII[c] = static_cast<char>(nameUTF16[c]);
		}
		FixPathSeperator(&nameASCII[0]);

		FString name = &nameASCII[0];
		name.ToLower();

		lump_p->LumpNameSetup(name);
		lump_p->LumpSize = static_cast<int>(SzArEx_GetFileSize(archPtr, i));
		lump_p->Owner = this;
		lump_p->Flags = LUMPF_ZIPFILE;
		lump_p->Position = i;
		lump_p->CheckEmbedded();
		lump_p++;
	}
	// Resize the lump record array to its actual size
	NumLumps -= skipped;

	if (NumLumps > 0)
	{
		// Quick check for unsupported compression method

		TArray<char> temp;
		temp.Resize(Lumps[0].LumpSize);

		if (SZ_OK != Archive->Extract(Lumps[0].Position, &temp[0]))
		{
			if (!quiet) Printf("\n%s: unsupported 7z/LZMA file!\n", Filename);
			return false;
		}
	}

	if (!quiet && !batchrun) Printf(", %d lumps\n", NumLumps);

	PostProcessArchive(&Lumps[0], sizeof(F7ZLump));
	return true;
}